

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::HttpClient::WebSocketResponse> * __thiscall
kj::_::NullableValue<kj::HttpClient::WebSocketResponse>::operator=
          (NullableValue<kj::HttpClient::WebSocketResponse> *this,
          NullableValue<kj::HttpClient::WebSocketResponse> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::~OneOf
                (&(this->field_1).value.webSocketOrBody);
    }
    if (other->isSet == true) {
      HttpClient::WebSocketResponse::WebSocketResponse
                (&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }